

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vpu720.c
# Opt level: O2

MPP_RET hal_jpege_vpu720_deinit(void *hal)

{
  MPP_RET MVar1;
  
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) enter\n","hal_jpege_vpu720_deinit",0xa1);
  }
  jpege_bits_deinit(*(JpegeBits *)((long)hal + 0xf0));
  if (*(void **)((long)hal + 0x70) != (void *)0x0) {
    mpp_osal_free("hal_jpege_vpu720_deinit",*(void **)((long)hal + 0x70));
  }
  *(undefined8 *)((long)hal + 0x70) = 0;
  if (*(void **)((long)hal + 0x1c8) != (void *)0x0) {
    mpp_osal_free("hal_jpege_vpu720_deinit",*(void **)((long)hal + 0x1c8));
  }
  *(undefined8 *)((long)hal + 0x1c8) = 0;
  if (*(MppDev *)((long)hal + 0x68) != (MppDev)0x0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x68));
    *(undefined8 *)((long)hal + 0x68) = 0;
  }
  if (*(MppBuffer *)((long)hal + 0x1c0) != (MppBuffer)0x0) {
    MVar1 = mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x1c0),"hal_jpege_vpu720_deinit");
    if (MVar1 != MPP_OK) {
      _mpp_log_l(2,"hal_jpege_vpu720","put qtbl buffer failed\n","hal_jpege_vpu720_deinit");
    }
  }
  if (*(MppBufferGroup *)((long)hal + 0x1b8) != (MppBufferGroup)0x0) {
    MVar1 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x1b8));
    if (MVar1 != MPP_OK) {
      _mpp_log_l(2,"hal_jpege_vpu720","group free buffer failed\n","hal_jpege_vpu720_deinit");
    }
  }
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vpu720","(%d) leave\n","hal_jpege_vpu720_deinit",0xba);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_jpege_vpu720_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    JpegeVpu720HalCtx *ctx = (JpegeVpu720HalCtx *)hal;

    hal_jpege_enter();
    jpege_bits_deinit(ctx->bits);

    MPP_FREE(ctx->regs);
    MPP_FREE(ctx->qtbl_sw_buf);

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }

    if (ctx->qtbl_buffer) {
        ret = mpp_buffer_put(ctx->qtbl_buffer);
        if (ret) {
            mpp_err_f("put qtbl buffer failed\n");
        }
    }

    if (ctx->group) {
        ret = mpp_buffer_group_put(ctx->group);
        if (ret) {
            mpp_err_f("group free buffer failed\n");
        }
    }

    hal_jpege_leave();
    return MPP_OK;
}